

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

wchar_t price_item(store *store,object *obj,_Bool store_buying,wchar_t qty)

{
  owner *poVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t local_64;
  wchar_t local_60;
  wchar_t local_58;
  wchar_t local_50;
  wchar_t local_48;
  player_race_list *local_40;
  player_race_list *dislikes;
  owner *proprietor;
  wchar_t price;
  wchar_t adjust;
  wchar_t qty_local;
  _Bool store_buying_local;
  object *obj_local;
  store *store_local;
  
  if (store == (store *)0x0) {
    store_local._4_4_ = L'\0';
  }
  else {
    poVar1 = store->owner;
    _Var2 = tval_can_have_charges(obj);
    if (_Var2) {
      if (store_buying) {
        wVar3 = object_value_real(obj,qty);
        wVar4 = object_value(obj,qty);
        if (wVar4 < wVar3) {
          local_48 = object_value(obj,qty);
        }
        else {
          local_48 = object_value_real(obj,qty);
        }
        proprietor._0_4_ = local_48;
      }
      else {
        wVar3 = object_value_real(obj,qty);
        wVar4 = object_value(obj,qty);
        if (wVar3 < wVar4) {
          local_50 = object_value(obj,qty);
        }
        else {
          local_50 = object_value_real(obj,qty);
        }
        proprietor._0_4_ = local_50;
      }
    }
    else if (store_buying) {
      wVar3 = object_value_real(obj,L'\x01');
      wVar4 = object_value(obj,L'\x01');
      if (wVar4 < wVar3) {
        local_58 = object_value(obj,L'\x01');
      }
      else {
        local_58 = object_value_real(obj,L'\x01');
      }
      proprietor._0_4_ = local_58;
    }
    else {
      wVar3 = object_value_real(obj,L'\x01');
      wVar4 = object_value(obj,L'\x01');
      if (wVar3 < wVar4) {
        local_60 = object_value(obj,L'\x01');
      }
      else {
        local_60 = object_value_real(obj,L'\x01');
      }
      proprietor._0_4_ = local_60;
    }
    if ((wchar_t)proprietor < L'\x01') {
      local_64 = qty;
      if (store_buying) {
        local_64 = L'\0';
      }
      store_local._4_4_ = local_64;
    }
    else {
      for (local_40 = poVar1->race->dislikes;
          (local_40 != (player_race_list *)0x0 && (local_40->race != player->race));
          local_40 = local_40->next) {
      }
      proprietor._4_4_ = local_40->rel;
      _Var2 = store_is_black_market(store);
      if (_Var2) {
        proprietor._4_4_ = (proprietor._4_4_ * 3) / 2;
      }
      if (store_buying) {
        proprietor._4_4_ = L'È' - proprietor._4_4_;
        if (L'd' < proprietor._4_4_) {
          proprietor._4_4_ = L'd';
        }
        proprietor._0_4_ = ((wchar_t)proprietor << 1) / 3;
        _Var2 = store_is_black_market(store);
        if (_Var2) {
          proprietor._0_4_ = (wchar_t)proprietor / 2;
        }
        if (((player->opts).opt[0x25] & 1U) != 0) {
          return L'\0';
        }
      }
      else {
        _Var2 = tval_can_have_charges(obj);
        if (_Var2) {
          proprietor._0_4_ = object_value_real(obj,qty);
        }
        else {
          proprietor._0_4_ = object_value_real(obj,L'\x01');
        }
        _Var2 = store_is_black_market(store);
        if (_Var2) {
          proprietor._0_4_ = (wchar_t)proprietor << 1;
        }
      }
      proprietor._0_4_ = (wchar_t)(((long)((wchar_t)proprietor * proprietor._4_4_) + 0x32) / 100);
      _Var2 = tval_can_have_charges(obj);
      if (!_Var2) {
        proprietor._0_4_ = qty * (wchar_t)proprietor;
      }
      if ((store_buying) && (poVar1->max_cost * qty < (wchar_t)proprietor)) {
        proprietor._0_4_ = poVar1->max_cost * qty;
      }
      store_local._4_4_ = qty;
      if (L'\0' < (wchar_t)proprietor) {
        store_local._4_4_ = (wchar_t)proprietor;
      }
    }
  }
  return store_local._4_4_;
}

Assistant:

int price_item(struct store *store, const struct object *obj,
			   bool store_buying, int qty)
{
	int adjust = 100;
	int price;
	struct owner *proprietor;
	struct player_race_list *dislikes;

	if (!store) {
		return 0;
	}

	proprietor = store->owner;

	/* Get the value of the stack of wands, or a single item */
	if (tval_can_have_charges(obj)) {
		if (store_buying) {
			price = MIN(object_value_real(obj, qty),
				object_value(obj, qty));
		} else {
			price = MAX(object_value_real(obj, qty),
				object_value(obj, qty));
		}
	} else {
		if (store_buying) {
			price = MIN(object_value_real(obj, 1),
				object_value(obj, 1));
		} else {
			price = MAX(object_value_real(obj, 1),
				object_value(obj, 1));
		}
	}

	/* Worthless items */
	if (price <= 0) {
		return (store_buying) ? 0 : qty;
	}

	/* Compute the racial factor */
	dislikes = proprietor->race->dislikes;
	while (dislikes) {
		if (dislikes->race == player->race) break;
		dislikes = dislikes->next;
	}
	adjust = dislikes->rel;

	/* The black market is always a worse deal */
	if (store_is_black_market(store)) {
		adjust = (adjust * 3) / 2;
	}

	/* Shop is buying */
	if (store_buying) {
		/* Set the factor */
		adjust = 100 + (100 - adjust);
		if (adjust > 100) {
			adjust = 100;
		}

		/* Shops now pay 2/3 of true value */
		price = price * 2 / 3;

		/* Black market sucks */
		if (store_is_black_market(store)) {
			price = price / 2;
		}

		/* Check for no_selling option */
		if (OPT(player, birth_no_selling)) {
			return 0;
		}
	} else {
		/* Re-evaluate if we're selling */
		if (tval_can_have_charges(obj)) {
			price = object_value_real(obj, qty);
		} else {
			price = object_value_real(obj, 1);
		}

		/* Black market sucks */
		if (store_is_black_market(store)) {
			price = price * 2;
		}
	}

	/* Compute the final price (with rounding) */
	price = (price * adjust + 50L) / 100L;

	/* Now convert price to total price for non-wands */
	if (!tval_can_have_charges(obj)) {
		price *= qty;
	}

	/* Now limit the price to the purse limit */
	if (store_buying && (price > proprietor->max_cost * qty)) {
		price = proprietor->max_cost * qty;
	}

	/* Note -- Never become "free" */
	if (price <= 0) {
		return qty;
	}

	/* Return the price */
	return price;
}